

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O2

string * __thiscall
irr::scene::CB3DMeshFileLoader::readString_abi_cxx11_
          (string *__return_storage_ptr__,CB3DMeshFileLoader *this)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  c8 character;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",
             (allocator<char> *)((long)register0x00000020 + -0x21));
  while( true ) {
    iVar1 = (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&character,1);
    if ((CONCAT44(extraout_var,iVar1) == 0) || (character == '\0')) break;
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CB3DMeshFileLoader::readString()
{
	std::string newstring = "";
	while (true) {
		c8 character;
		if (B3DFile->read(&character, sizeof(character)) == 0)
			break; // eof
		if (character == 0)
			break;
		newstring.push_back(character);
	}
	return newstring;
}